

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O1

void __thiscall Shell::FunctionDefinitionExtra::output(FunctionDefinitionExtra *this,ostream *out)

{
  pointer ppTVar1;
  Term *this_00;
  bool bVar2;
  pointer ppTVar3;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"inlined=[",9);
  ppTVar3 = (this->lhs).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = (this->lhs).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar3 != ppTVar1) {
    bVar2 = true;
    do {
      this_00 = *ppTVar3;
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
      }
      Kernel::Term::toString_abi_cxx11_(&local_50,this_00,true);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      ppTVar3 = ppTVar3 + 1;
      bVar2 = false;
    } while (ppTVar3 != ppTVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  return;
}

Assistant:

void FunctionDefinitionExtra::output(std::ostream &out) const {
  bool first = true;
  out << "inlined=[";
  for(Term *t : lhs) {
    if(!first)
      out << ",";
    first = false;
    out << t->toString();
  }
  out << "]";
}